

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O1

void com_df_set_edge_hor(com_map_t *map,int i_scu,com_ref_pic_t (*refp) [2],int scu_x,int pix_y,
                        int cuw,int edgecondition)

{
  short sVar1;
  short sVar2;
  s8 (*pasVar3) [2];
  u8 *puVar4;
  s8 (*pasVar5) [2];
  s16 (*paasVar6) [2] [2];
  ushort uVar7;
  int iVar8;
  com_pic_t *pcVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  long lVar13;
  com_pic_t *pcVar14;
  com_pic_t *pcVar15;
  ushort uVar16;
  com_pic_t *pcVar17;
  
  pasVar3 = map->map_refi;
  lVar13 = (long)(pix_y * i_scu + scu_x);
  if ((long)pasVar3[lVar13][0] < 0) {
    pcVar14 = (com_pic_t *)0x0;
  }
  else {
    pcVar14 = refp[pasVar3[lVar13][0]][0].pic;
  }
  if ((long)pasVar3[lVar13][1] < 0) {
    pcVar9 = (com_pic_t *)0x0;
  }
  else {
    pcVar9 = refp[pasVar3[lVar13][1]][1].pic;
  }
  if (cuw != 0) {
    puVar4 = map->map_edge;
    iVar8 = scu_x + i_scu * (pix_y + -1);
    lVar11 = lVar13;
    do {
      bVar12 = 4;
      if (((byte)map->map_scu[iVar8] & 0x12) == 0) {
        pasVar5 = map->map_refi;
        if (pasVar3[lVar13] == pasVar5[iVar8]) {
          paasVar6 = map->map_mv;
          if (pasVar3[lVar13][0] < '\0') {
LAB_0011384d:
            if (pasVar3[lVar13][1] < '\0') {
LAB_00113972:
              bVar12 = 0;
            }
            else {
              iVar10 = (int)paasVar6[lVar11][1][0] - (int)paasVar6[iVar8][1][0];
              uVar7 = (ushort)iVar10;
              uVar16 = -uVar7;
              if (0 < iVar10) {
                uVar16 = uVar7;
              }
              if (uVar16 < 4) {
                sVar1 = paasVar6[lVar11][1][1];
                sVar2 = paasVar6[iVar8][1][1];
LAB_0011395a:
                uVar7 = (ushort)((int)sVar1 - (int)sVar2);
                uVar16 = -uVar7;
                if (0 < (int)sVar1 - (int)sVar2) {
                  uVar16 = uVar7;
                }
                if (uVar16 < 4) goto LAB_00113972;
              }
            }
          }
          else {
            iVar10 = (int)paasVar6[lVar11][0][0] - (int)paasVar6[iVar8][0][0];
            uVar7 = (ushort)iVar10;
            uVar16 = -uVar7;
            if (0 < iVar10) {
              uVar16 = uVar7;
            }
            if (uVar16 < 4) {
              iVar10 = (int)paasVar6[lVar11][0][1] - (int)paasVar6[iVar8][0][1];
              uVar7 = (ushort)iVar10;
              uVar16 = -uVar7;
              if (0 < iVar10) {
                uVar16 = uVar7;
              }
              if (uVar16 < 4) goto LAB_0011384d;
            }
          }
        }
        else {
          if ((long)pasVar5[iVar8][0] < 0) {
            pcVar15 = (com_pic_t *)0x0;
          }
          else {
            pcVar15 = refp[pasVar5[iVar8][0]][0].pic;
          }
          if ((long)pasVar5[iVar8][1] < 0) {
            pcVar17 = (com_pic_t *)0x0;
          }
          else {
            pcVar17 = refp[pasVar5[iVar8][1]][1].pic;
          }
          if ((pcVar17 == pcVar14) && (pcVar15 == pcVar9)) {
            paasVar6 = map->map_mv;
            if (pasVar3[lVar13][0] < '\0') {
LAB_00113923:
              if (-1 < pasVar3[lVar13][1]) {
                iVar10 = (int)paasVar6[lVar11][1][0] - (int)paasVar6[iVar8][0][0];
                uVar7 = (ushort)iVar10;
                uVar16 = -uVar7;
                if (0 < iVar10) {
                  uVar16 = uVar7;
                }
                if (3 < uVar16) goto LAB_001137d9;
                sVar1 = paasVar6[lVar11][1][1];
                sVar2 = paasVar6[iVar8][0][1];
                goto LAB_0011395a;
              }
              goto LAB_00113972;
            }
            iVar10 = (int)paasVar6[lVar11][0][0] - (int)paasVar6[iVar8][1][0];
            uVar7 = (ushort)iVar10;
            uVar16 = -uVar7;
            if (0 < iVar10) {
              uVar16 = uVar7;
            }
            if (uVar16 < 4) {
              iVar10 = (int)paasVar6[lVar11][0][1] - (int)paasVar6[iVar8][1][1];
              uVar7 = (ushort)iVar10;
              uVar16 = -uVar7;
              if (0 < iVar10) {
                uVar16 = uVar7;
              }
              if (uVar16 < 4) goto LAB_00113923;
            }
          }
        }
      }
LAB_001137d9:
      puVar4[lVar11] = puVar4[lVar11] | bVar12;
      cuw = cuw + -1;
      iVar8 = iVar8 + 1;
      lVar11 = lVar11 + 1;
    } while (cuw != 0);
  }
  return;
}

Assistant:

static void uavs3d_always_inline com_df_set_edge_hor_inline(com_map_t *map, int i_scu, com_ref_pic_t refp[MAX_REFS][REFP_NUM], int scu_x, int scu_y, int w, int edgecondition)
{
    int scup = scu_y * i_scu + scu_x;
    u8 *edge_filter = map->map_edge + scup;
    s8 *refi_p = map->map_refi[scup];
    com_pic_t *p_pic0 = REFI_IS_VALID(refi_p[REFP_0]) ? refp[refi_p[REFP_0]][REFP_0].pic : NULL;
    com_pic_t *p_pic1 = REFI_IS_VALID(refi_p[REFP_1]) ? refp[refi_p[REFP_1]][REFP_1].pic : NULL;

    edgecondition <<= 2;

    while (w--) {
        *edge_filter++ |= skip_filter(map, refp, refi_p, p_pic0, p_pic1, scup++, -i_scu) ? 0 : edgecondition;
    }
}